

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void encodeTriple(char *result,int difx,int dify)

{
  int dify_local;
  int difx_local;
  char *result_local;
  
  if (dify < 0x88) {
    *result = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[difx / 0x1c + (dify / 0x22) * 6];
    encodeBase31(result + 1,(difx % 0x1c) * 0x22 + dify % 0x22,2);
  }
  else {
    *result = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[difx / 0x18 + 0x18];
    encodeBase31(result + 1,(difx % 0x18) * 0x28 + dify + -0x88,2);
  }
  return;
}

Assistant:

static void encodeTriple(char *result, const int difx, const int dify) {
    ASSERT(result);
    if (dify < 4 * 34) // first 4(x34) rows of 6(x28) wide
    {
        *result = ENCODE_CHARS[((difx / 28) + 6 * (dify / 34))];
        encodeBase31(result + 1, ((difx % 28) * 34 + (dify % 34)), 2);
    } else // bottom row
    {
        *result = ENCODE_CHARS[(difx / 24) + 24];
        encodeBase31(result + 1, (difx % 24) * 40 + (dify - 136), 2);
    }
}